

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O0

Vector<double,_std::allocator<double>_> * __thiscall
amrex::MultiFab::norm0
          (MultiFab *this,Vector<int,_std::allocator<int>_> *comps,int nghost,bool local,
          bool ignore_covered)

{
  bool bVar1;
  Long LVar2;
  double *pdVar3;
  undefined8 in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  Vector<double,_std::allocator<double>_> *in_RDI;
  byte in_R8B;
  byte in_R9B;
  int comp;
  const_iterator __end1;
  const_iterator __begin1;
  Vector<int,_std::allocator<int>_> *__range1;
  int n;
  Vector<double,_std::allocator<double>_> *nm0;
  undefined1 in_stack_0000027e;
  undefined1 in_stack_0000027f;
  int in_stack_00000280;
  int in_stack_00000284;
  MultiFab *in_stack_00000288;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 uVar4;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  undefined8 local_40;
  undefined1 local_25;
  undefined4 local_24;
  byte local_1e;
  byte local_1d;
  undefined8 local_18;
  
  local_1d = in_R8B & 1;
  local_1e = in_R9B & 1;
  local_18 = in_RDX;
  LVar2 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0xfeaf13);
  local_24 = (undefined4)LVar2;
  local_25 = 0;
  Vector<double,_std::allocator<double>_>::Vector
            ((Vector<double,_std::allocator<double>_> *)0xfeaf2c);
  std::vector<double,_std::allocator<double>_>::reserve(in_RSI,(size_type)in_RDI);
  local_40 = local_18;
  local_48._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff58);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_ffffffffffffff58), bVar1) {
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              (&local_48);
    norm0(in_stack_00000288,in_stack_00000284,in_stack_00000280,(bool)in_stack_0000027f,
          (bool)in_stack_0000027e);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (value_type_conflict1 *)in_stack_ffffffffffffff58);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_48);
  }
  if ((local_1d & 1) == 0) {
    pdVar3 = Vector<double,_std::allocator<double>_>::dataPtr
                       ((Vector<double,_std::allocator<double>_> *)0xfeb01e);
    uVar4 = local_24;
    ParallelContext::CommunicatorSub();
    ParallelAllReduce::Max<double>
              ((double *)CONCAT44(uVar4,in_stack_ffffffffffffff60),(int)((ulong)pdVar3 >> 0x20),
               (MPI_Comm)pdVar3);
  }
  return in_RDI;
}

Assistant:

Vector<Real>
MultiFab::norm0 (const Vector<int>& comps, int nghost, bool local, bool ignore_covered) const
{
    int n = comps.size();
    Vector<Real> nm0;
    nm0.reserve(n);

    for (int comp : comps) {
        nm0.push_back(this->norm0(comp, nghost, true, ignore_covered));
    }

    if (!local) {
        ParallelAllReduce::Max(nm0.dataPtr(), n, ParallelContext::CommunicatorSub());
    }

    return nm0;
}